

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O2

void gimage::imageToColor<float,gimage::PixelTraits<float>>
               (Image<float,_gimage::PixelTraits<float>_> *ret,
               Image<float,_gimage::PixelTraits<float>_> *image)

{
  float fVar1;
  float ***pppfVar2;
  float ***pppfVar3;
  float *pfVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long i;
  long lVar8;
  
  Image<float,_gimage::PixelTraits<float>_>::setSize(ret,image->width,image->height,3);
  lVar6 = 0;
  lVar5 = image->width;
  if (image->width < 1) {
    lVar5 = lVar6;
  }
  lVar7 = image->height;
  if (image->height < 1) {
    lVar7 = lVar6;
  }
  for (; lVar6 != lVar7; lVar6 = lVar6 + 1) {
    pppfVar2 = image->img;
    pppfVar3 = ret->img;
    for (lVar8 = 0; lVar5 != lVar8; lVar8 = lVar8 + 1) {
      pfVar4 = (*pppfVar2)[lVar6];
      fVar1 = pfVar4[lVar8];
      (*pppfVar3)[lVar6][lVar8] = fVar1;
      pppfVar3[1][lVar6][lVar8] = fVar1;
      pppfVar3[2][lVar6][lVar8] = pfVar4[lVar8];
    }
  }
  return;
}

Assistant:

void imageToColor(Image<T, traits> &ret, const Image<T, traits> &image)
{
  assert(image.getDepth() == 1);

  ret.setSize(image.getWidth(), image.getHeight(), 3);

  for (long k=0; k<image.getHeight(); k++)
  {
    for (long i=0; i<image.getWidth(); i++)
    {
      ret.set(i, k, 0, image.get(i, k, 0));
      ret.set(i, k, 1, image.get(i, k, 0));
      ret.set(i, k, 2, image.get(i, k, 0));
    }
  }
}